

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

my_rational my_rational_product(my_rational *a,my_rational *b)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  my_rational mVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint a_00;
  uint16_t q_u16n [2];
  uint16_t a_u16n [2];
  uint16_t b_u16n [2];
  uint16_t d_u16n [4];
  uint16_t r_u16n [6];
  uint16_t n_u16n [4];
  uint16_t w_u16n [5];
  uint16_t sr_u16n [6];
  
  uVar10 = b->d;
  uVar12 = a->n;
  while (uVar5 = uVar10, uVar5 != 0) {
    uVar10 = uVar12 % uVar5;
    uVar12 = uVar5;
  }
  uVar10 = b->n;
  uVar5 = uVar10;
  uVar6 = a->d;
  while (uVar13 = uVar5, uVar13 != 0) {
    uVar5 = uVar6 % uVar13;
    uVar6 = uVar13;
  }
  uVar11 = (ulong)a->n / (ulong)uVar12;
  uVar1 = (ulong)a->d / (ulong)uVar6;
  uVar2 = (ulong)b->d / (ulong)uVar12;
  a_00 = (uint)((ulong)uVar10 / (ulong)uVar6);
  uVar13 = (uint)uVar11;
  uVar5 = (uint)uVar1;
  uVar12 = (uint)uVar2;
  if (((uVar10 < uVar6) || ((int)(((ulong)uVar10 / (ulong)uVar6) * uVar11 >> 0x20) == 0)) &&
     ((int)(uVar2 * uVar1 >> 0x20) == 0)) {
    mVar9.n = a_00 * uVar13;
    mVar9.d = 0;
    uVar11 = (ulong)(uVar12 * uVar5);
  }
  else {
    _Var3 = ini_u16n(a_u16n,2,uVar13);
    if (_Var3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x736,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var3 = ini_u16n(b_u16n,2,a_00);
    if (_Var3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x73a,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var3 = mul_u16n(n_u16n,a_u16n,b_u16n,4,2,2);
    if (_Var3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x73f,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var3 = ini_u16n(a_u16n,2,uVar5);
    if (_Var3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x743,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var3 = ini_u16n(b_u16n,2,uVar12);
    if (_Var3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x747,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var3 = mul_u16n(d_u16n,a_u16n,b_u16n,4,2,2);
    if (_Var3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x74c,
                    "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                   );
    }
    wVar4 = div_u16n(q_u16n,r_u16n,w_u16n,n_u16n,d_u16n,2,4,4);
    uVar10 = 1;
    uVar12 = 0xffffffff;
    if (wVar4 == L'\0') {
      sVar7 = msb_u16n(q_u16n,2);
      if (sVar7 < 0x21) {
        uVar5 = ext_u16n(q_u16n,2);
        if (uVar5 == 0xffffffff) {
          uVar10 = 1;
        }
        else {
          uVar10 = (uint)(0xffffffff / (ulong)(uVar5 + 1));
        }
        _Var3 = ini_u16n(a_u16n,2,uVar10);
        if (_Var3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                        ,0x75d,
                        "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                       );
        }
        _Var3 = mul_u16n(sr_u16n,r_u16n,a_u16n,6,4,2);
        if (_Var3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                        ,0x762,
                        "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                       );
        }
        wVar4 = div_u16n(q_u16n,r_u16n,w_u16n,sr_u16n,d_u16n,2,6,4);
        if (wVar4 != L'\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                        ,0x767,
                        "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                       );
        }
        sVar7 = msb_u16n(q_u16n,2);
        if (0x20 < sVar7) {
          __assert_fail("msb_u16n(q_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                        ,0x76a,
                        "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                       );
        }
        uVar6 = ext_u16n(q_u16n,2);
        uVar12 = uVar6 + uVar5 * uVar10;
        if (CARRY4(uVar6,uVar5 * uVar10)) {
          __assert_fail("rn <= UINT_MAX - t",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                        ,0x76c,
                        "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                       );
        }
        sVar7 = msb_u16n(r_u16n,6);
        sVar8 = msb_u16n(d_u16n,4);
        if (sVar8 <= sVar7 + 1) {
          if (uVar12 == 0xffffffff) {
            __assert_fail("rn < UINT_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                          ,0x771,
                          "struct my_rational my_rational_product(const struct my_rational *, const struct my_rational *)"
                         );
          }
          uVar12 = uVar12 + 1;
        }
      }
    }
    mVar9 = my_rational_construct(uVar12,uVar10);
    uVar11 = (ulong)mVar9 >> 0x20;
  }
  return (my_rational)((ulong)mVar9 & 0xffffffff | uVar11 << 0x20);
}

Assistant:

struct my_rational my_rational_product(const struct my_rational *a,
		const struct my_rational *b)
{
	unsigned int g1 = gcd(a->n, b->d);
	unsigned int g2 = gcd(a->d, b->n);
	unsigned int anr = a->n / g1;
	unsigned int adr = a->d / g2;
	unsigned int bnr = b->n / g2;
	unsigned int bdr = b->d / g1;
	struct my_rational result;

	if ((bnr && anr > UINT_MAX / bnr) || (adr > UINT_MAX / bdr)) {
		/* Overflows in native arithmetic so approximate. */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t a_u16n[MP_DIGITS], b_u16n[MP_DIGITS];
		uint16_t n_u16n[2 * MP_DIGITS], d_u16n[2 * MP_DIGITS];
		uint16_t q_u16n[MP_DIGITS], r_u16n[3 * MP_DIGITS];
		uint16_t sr_u16n[3 * MP_DIGITS], w_u16n[2 * MP_DIGITS + 1];
		unsigned int rn, rd;
		bool over;

		over = ini_u16n(a_u16n, MP_DIGITS, anr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bnr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(n_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = ini_u16n(a_u16n, MP_DIGITS, adr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bdr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(d_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(q_u16n, r_u16n, w_u16n, n_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS, 2 * MP_DIGITS) != 0);
		if (!over && msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT) {
			unsigned int t;

			rn = ext_u16n(q_u16n, MP_DIGITS);
			/*
			 * Use as large as possible of a denominator so the
			 * approximation is as accurate as possible.
			 */
			rd = (rn < UINT_MAX) ? UINT_MAX / (rn + 1) : 1;
			rn *= rd;
			over = ini_u16n(a_u16n, MP_DIGITS, rd);
			if (over) {
				assert(0);
			}
			over = mul_u16n(sr_u16n, r_u16n, a_u16n, 3 * MP_DIGITS,
				2 * MP_DIGITS, MP_DIGITS);
			if (over) {
				assert(0);
			}
			over = div_u16n(q_u16n, r_u16n, w_u16n, sr_u16n, d_u16n,
				MP_DIGITS, 3 * MP_DIGITS, 2 * MP_DIGITS);
			if (over) {
				assert(0);
			}
			assert(msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT);
			t = ext_u16n(q_u16n, MP_DIGITS);
			assert(rn <= UINT_MAX - t);
			rn += t;
			/* Approximate rounding to the nearest. */
			if (msb_u16n(r_u16n, 3 * MP_DIGITS) + 1
					>= msb_u16n(d_u16n, 2 * MP_DIGITS)) {
				assert(rn < UINT_MAX);
				++rn;
			}
		} else {
			rn = UINT_MAX;
			rd = 1;
		}
		return my_rational_construct(rn, rd);
#undef MP_DIGITS
	}
	result.n = anr * bnr;
	result.d = adr * bdr;
	return result;
}